

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.c
# Opt level: O0

LY_ERR ly_path_dup_predicates(ly_ctx *ctx,ly_path_predicate *pred,ly_path_predicate **dup)

{
  int *piVar1;
  ly_path_pred_type lVar2;
  char *pcVar3;
  char *local_78;
  long local_68;
  long local_58;
  long local_50;
  long *local_38;
  char *p__;
  uint64_t u;
  ly_path_predicate **dup_local;
  ly_path_predicate *pred_local;
  ly_ctx *ctx_local;
  
  if (pred != (ly_path_predicate *)0x0) {
    if (*dup == (ly_path_predicate *)0x0) {
      if (pred == (ly_path_predicate *)0x0) {
        local_58 = 0;
      }
      else {
        local_58 = *(long *)((long)&pred[-1].field_1 + 0x28);
      }
      local_38 = (long *)calloc(1,local_58 * 0x38 + 8);
      if (local_38 == (long *)0x0) {
        ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","ly_path_dup_predicates");
        return LY_EMEM;
      }
    }
    else {
      if (pred == (ly_path_predicate *)0x0) {
        local_50 = 0;
      }
      else {
        local_50 = *(long *)((long)&pred[-1].field_1 + 0x28);
      }
      local_38 = (long *)realloc((void *)((long)&(*dup)[-1].field_1 + 0x28),
                                 (*(long *)((long)&(*dup)[-1].field_1 + 0x28) + local_50) * 0x38 + 8
                                );
      if (local_38 == (long *)0x0) {
        ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","ly_path_dup_predicates");
        return LY_EMEM;
      }
    }
    *dup = (ly_path_predicate *)(local_38 + 1);
    if (*dup != (ly_path_predicate *)0x0) {
      if (pred == (ly_path_predicate *)0x0) {
        local_68 = 0;
      }
      else {
        local_68 = *(long *)((long)&pred[-1].field_1 + 0x28);
      }
      memset(*dup + *local_38,0,local_68 * 0x38);
    }
    p__ = (char *)0x0;
    while( true ) {
      if (pred == (ly_path_predicate *)0x0) {
        local_78 = (char *)0x0;
      }
      else {
        local_78 = *(char **)((long)&pred[-1].field_1 + 0x28);
      }
      if (local_78 <= p__) break;
      *(long *)((long)&(*dup)[-1].field_1 + 0x28) = *(long *)((long)&(*dup)[-1].field_1 + 0x28) + 1;
      (*dup)[(long)p__].type = pred->type;
      lVar2 = pred[(long)p__].type;
      if (lVar2 == LY_PATH_PREDTYPE_POSITION) {
        (*dup)[(long)p__].field_1.position = pred[(long)p__].field_1.position;
      }
      else if (lVar2 - LY_PATH_PREDTYPE_LIST < 2) {
        (*dup)[(long)p__].field_1.position = pred[(long)p__].field_1.position;
        (**(code **)(*(long *)(*(long *)((long)&pred[(long)p__].field_1 + 0x10) + 0x10) + 0x30))
                  (ctx,(undefined1 *)((long)&pred[(long)p__].field_1 + 8),
                   (undefined1 *)((long)&(*dup)[(long)p__].field_1 + 8));
        LOCK();
        piVar1 = (int *)(*(long *)((long)&pred[(long)p__].field_1 + 0x10) + 0x1c);
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      else if (lVar2 == LY_PATH_PREDTYPE_LIST_VAR) {
        (*dup)[(long)p__].field_1.position = pred[(long)p__].field_1.position;
        pcVar3 = strdup(*(char **)((long)&pred[(long)p__].field_1 + 8));
        *(char **)((long)&(*dup)[(long)p__].field_1 + 8) = pcVar3;
      }
      p__ = p__ + 1;
    }
  }
  return LY_SUCCESS;
}

Assistant:

static LY_ERR
ly_path_dup_predicates(const struct ly_ctx *ctx, const struct ly_path_predicate *pred, struct ly_path_predicate **dup)
{
    LY_ARRAY_COUNT_TYPE u;

    if (!pred) {
        return LY_SUCCESS;
    }

    LY_ARRAY_CREATE_RET(ctx, *dup, LY_ARRAY_COUNT(pred), LY_EMEM);
    LY_ARRAY_FOR(pred, u) {
        LY_ARRAY_INCREMENT(*dup);
        (*dup)[u].type = pred->type;

        switch (pred[u].type) {
        case LY_PATH_PREDTYPE_POSITION:
            /* position-predicate */
            (*dup)[u].position = pred[u].position;
            break;
        case LY_PATH_PREDTYPE_LIST:
        case LY_PATH_PREDTYPE_LEAFLIST:
            /* key-predicate or leaf-list-predicate */
            (*dup)[u].key = pred[u].key;
            pred[u].value.realtype->plugin->duplicate(ctx, &pred[u].value, &(*dup)[u].value);
            LY_ATOMIC_INC_BARRIER(((struct lysc_type *)pred[u].value.realtype)->refcount);
            break;
        case LY_PATH_PREDTYPE_LIST_VAR:
            /* key-predicate with a variable */
            (*dup)[u].key = pred[u].key;
            (*dup)[u].variable = strdup(pred[u].variable);
            break;
        }
    }

    return LY_SUCCESS;
}